

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_filter_dquot_scalar(Parser *this,substr s)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  uint32_t uVar16;
  char cVar17;
  csubstr cVar18;
  substr sVar19;
  substr r;
  substr r_00;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  csubstr fmt_02;
  csubstr fmt_03;
  csubstr fmt_04;
  substr dst;
  size_t pos;
  ulong local_d0;
  char readbuf [8];
  undefined7 uStack_c0;
  undefined1 uStack_b9;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  substr s_local;
  
  s_local.str = s.str;
  s_local.len = s.len;
  sVar9 = basic_substring<char>::count(&s_local,'\\',0);
  _grow_filter_arena(this,s.len + sVar9 * 2);
  sVar9 = s_local.len;
  pcVar6 = s_local.str;
  pos = 0;
  sVar19.len = s_local.len;
  sVar19.str = s_local.str;
  local_d0 = 0;
  bVar7 = false;
  do {
    if (sVar9 <= local_d0) {
      if ((this->m_filter_arena).len < pos) {
        builtin_strncpy(readbuf,"check fa",8);
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar18 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_48 = cVar18.len;
        pcStack_50 = cVar18.str;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7d53) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x7d53) << 0x40,8);
        LVar4.name.str = pcStack_50;
        LVar4.name.len = local_48;
        (*p_Var2)(readbuf,0x2a,LVar4,(this->m_stack).m_callbacks.m_user_data);
      }
      if (pos < sVar9 || bVar7 != false) {
        dst.len = sVar9;
        dst.str = pcVar6;
        sVar19 = _finish_filter_arena(this,dst,pos);
      }
      if (s_local.len < sVar19.len) {
        builtin_strncpy(readbuf,"check fa",8);
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar18 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_70 = cVar18.len;
        pcStack_78 = cVar18.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7d59) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7d59) << 0x40,8);
        LVar5.name.str = pcStack_78;
        LVar5.name.len = local_70;
        (*p_Var2)(readbuf,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      cVar18.str = sVar19.str;
      cVar18.len = sVar19.len;
      return cVar18;
    }
    cVar17 = pcVar6[local_d0];
    if (cVar17 == '\t') {
LAB_0021336d:
      r.len = sVar9;
      r.str = pcVar6;
      _filter_ws<true>(this,r,&local_d0,&pos);
      goto switchD_002133d6_caseD_5d;
    }
    if (cVar17 == '\n') {
      r_00.len = sVar9;
      r_00.str = pcVar6;
      bVar7 = _filter_nl<true,true>(this,r_00,&local_d0,&pos,0);
      goto switchD_002133d6_caseD_5d;
    }
    if (cVar17 == '\r') goto switchD_002133d6_caseD_5d;
    if (cVar17 != '\\') {
      if (cVar17 == ' ') goto LAB_0021336d;
      (this->m_filter_arena).str[pos] = cVar17;
      pos = pos + 1;
      goto switchD_002133d6_caseD_5d;
    }
    uVar14 = local_d0 + 1;
    bVar7 = true;
    if (sVar9 <= uVar14) goto switchD_002133d6_caseD_5d;
    cVar17 = pcVar6[uVar14];
    switch(cVar17) {
    case '\\':
      (this->m_filter_arena).str[pos] = '\\';
      pos = pos + 1;
      break;
    case ']':
    case '^':
    case '`':
    case 'c':
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'o':
    case 'p':
    case 'q':
    case 's':
    case 'w':
      goto switchD_002133d6_caseD_5d;
    case '_':
      (this->m_filter_arena).str[pos] = -0x3e;
      (this->m_filter_arena).str[pos + 1] = -0x60;
      pos = pos + 2;
      break;
    case 'a':
      (this->m_filter_arena).str[pos] = '\a';
      pos = pos + 1;
      break;
    case 'b':
      (this->m_filter_arena).str[pos] = '\b';
      pos = pos + 1;
      break;
    case 'e':
      (this->m_filter_arena).str[pos] = '\x1b';
      pos = pos + 1;
      break;
    case 'f':
      (this->m_filter_arena).str[pos] = '\f';
      pos = pos + 1;
      break;
    case 'n':
      (this->m_filter_arena).str[pos] = '\n';
      pos = pos + 1;
      break;
    case 'r':
      (this->m_filter_arena).str[pos] = '\r';
      pos = pos + 1;
      break;
    case 't':
      (this->m_filter_arena).str[pos] = '\t';
      pos = pos + 1;
      break;
    case 'u':
      if (sVar9 <= local_d0 + 5) {
        bVar7 = is_debugger_attached();
        if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        fmt_00.len = 0x1f;
        fmt_00.str = "ERROR: \\u requires 4 hex digits";
        _err<>(this,fmt_00);
      }
      if (sVar9 < local_d0 + 2) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153a,"first >= 0 && first <= len");
      }
      if (sVar9 < 4) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (sVar9 < local_d0 + 6) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)readbuf,pcVar6 + local_d0 + 2,4);
      if ((CONCAT17(uStack_b9,uStack_c0) == 0) || (readbuf == (char  [8])0x0)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x2cac,"!s.empty()");
      }
      uVar16 = 0;
      for (lVar10 = 0; CONCAT17(uStack_b9,uStack_c0) != lVar10; lVar10 = lVar10 + 1) {
        cVar17 = *(char *)((long)readbuf + lVar10);
        iVar15 = -0x30;
        if (((9 < (byte)(cVar17 - 0x30U)) && (iVar15 = -0x57, 5 < (byte)(cVar17 + 0x9fU))) &&
           (iVar15 = -0x37, 5 < (byte)(cVar17 + 0xbfU))) {
          bVar7 = is_debugger_attached();
          if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          fmt_03.len = 0x23;
          fmt_03.str = "ERROR: failed to parse \\u codepoint";
          _err<>(this,fmt_03);
          break;
        }
        uVar16 = uVar16 * 0x10 + iVar15 + (int)cVar17;
      }
      sVar12 = decode_code_point((uint8_t *)readbuf,8,uVar16);
      memcpy((this->m_filter_arena).str + pos,readbuf,sVar12);
      pos = pos + sVar12;
      local_d0 = local_d0 + 5;
      goto LAB_00213a61;
    case 'v':
      (this->m_filter_arena).str[pos] = '\v';
      pos = pos + 1;
      break;
    case 'x':
      if (sVar9 <= local_d0 + 3) {
        bVar7 = is_debugger_attached();
        if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        fmt_01.len = 0x1f;
        fmt_01.str = "ERROR: \\x requires 2 hex digits";
        _err<>(this,fmt_01);
      }
      if (sVar9 < local_d0 + 2) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153a,"first >= 0 && first <= len");
      }
      if (sVar9 < local_d0 + 4) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)readbuf,pcVar6 + local_d0 + 2,2);
      if ((CONCAT17(uStack_b9,uStack_c0) == 0) || (readbuf == (char  [8])0x0)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar18 = (csubstr)(*pcVar3)();
          return cVar18;
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x2cac,"!s.empty()");
      }
      cVar17 = '\0';
      for (lVar10 = 0; CONCAT17(uStack_b9,uStack_c0) != lVar10; lVar10 = lVar10 + 1) {
        cVar1 = *(char *)((long)readbuf + lVar10);
        bVar13 = cVar1 - 0x30;
        if (9 < bVar13) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar13 = cVar1 + 0xa9;
          }
          else {
            if (5 < (byte)(cVar1 + 0xbfU)) {
              bVar7 = is_debugger_attached();
              if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                pcVar3 = (code *)swi(3);
                cVar18 = (csubstr)(*pcVar3)();
                return cVar18;
              }
              fmt_04.len = 0x22;
              fmt_04.str = "ERROR: failed to read \\x codepoint";
              _err<>(this,fmt_04);
              break;
            }
            bVar13 = cVar1 - 0x37;
          }
        }
        cVar17 = cVar17 * '\x10' + bVar13;
      }
      (this->m_filter_arena).str[pos] = cVar17;
      local_d0 = local_d0 + 3;
      pos = pos + 1;
LAB_00213a61:
      bVar7 = true;
      goto switchD_002133d6_caseD_5d;
    default:
      switch(cVar17) {
      case 'L':
        (this->m_filter_arena).str[pos] = -0x1e;
        lVar10 = pos + 2;
        (this->m_filter_arena).str[pos + 1] = -0x80;
        pos = pos + 3;
        (this->m_filter_arena).str[lVar10] = -0x58;
        break;
      case 'M':
      case 'O':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
        goto switchD_002133d6_caseD_5d;
      case 'N':
        lVar10 = pos + 1;
        (this->m_filter_arena).str[pos] = -0x3e;
        pos = pos + 2;
        (this->m_filter_arena).str[lVar10] = -0x7b;
        break;
      case 'P':
        (this->m_filter_arena).str[pos] = -0x1e;
        lVar10 = pos + 2;
        (this->m_filter_arena).str[pos + 1] = -0x80;
        pos = pos + 3;
        (this->m_filter_arena).str[lVar10] = -0x57;
        break;
      case 'U':
        if (sVar9 <= local_d0 + 9) {
          bVar7 = is_debugger_attached();
          if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          fmt.len = 0x1f;
          fmt.str = "ERROR: \\U requires 8 hex digits";
          _err<>(this,fmt);
        }
        if (sVar9 < local_d0 + 2) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          handle_error(0x22b919,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153a,"first >= 0 && first <= len");
        }
        if (sVar9 < 8) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          handle_error(0x22b919,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
        }
        if (sVar9 < local_d0 + 10) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          handle_error(0x22b919,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
        }
        basic_substring<char>::basic_substring
                  ((basic_substring<char> *)readbuf,pcVar6 + local_d0 + 2,8);
        if ((CONCAT17(uStack_b9,uStack_c0) == 0) || (readbuf == (char  [8])0x0)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            cVar18 = (csubstr)(*pcVar3)();
            return cVar18;
          }
          handle_error(0x22b919,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cac,"!s.empty()");
        }
        uVar16 = 0;
        for (lVar10 = 0; CONCAT17(uStack_b9,uStack_c0) != lVar10; lVar10 = lVar10 + 1) {
          cVar17 = *(char *)((long)readbuf + lVar10);
          iVar15 = -0x30;
          if (((9 < (byte)(cVar17 - 0x30U)) && (iVar15 = -0x57, 5 < (byte)(cVar17 + 0x9fU))) &&
             (iVar15 = -0x37, 5 < (byte)(cVar17 + 0xbfU))) {
            bVar7 = is_debugger_attached();
            if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar3 = (code *)swi(3);
              cVar18 = (csubstr)(*pcVar3)();
              return cVar18;
            }
            fmt_02.len = 0x23;
            fmt_02.str = "ERROR: failed to parse \\U codepoint";
            _err<>(this,fmt_02);
            break;
          }
          uVar16 = uVar16 * 0x10 + iVar15 + (int)cVar17;
        }
        sVar12 = decode_code_point((uint8_t *)readbuf,8,uVar16);
        memcpy((this->m_filter_arena).str + pos,readbuf,sVar12);
        pos = pos + sVar12;
        local_d0 = local_d0 + 9;
        goto LAB_00213a61;
      default:
        if (cVar17 == '\t') {
LAB_002134d7:
          (this->m_filter_arena).str[pos] = cVar17;
          pos = pos + 1;
          break;
        }
        uVar11 = local_d0;
        if (cVar17 != '\n') {
          if (cVar17 == '0') {
            (this->m_filter_arena).str[pos] = '\0';
            pos = pos + 1;
            break;
          }
          if (((cVar17 == ' ') || (cVar17 == '\"')) || (cVar17 == '/')) goto LAB_002134d7;
          if (((cVar17 != '\r') || (sVar9 <= local_d0 + 2)) ||
             (uVar11 = uVar14, pcVar6[local_d0 + 2] != '\n')) goto switchD_002133d6_caseD_5d;
        }
        uVar11 = uVar11 + 2;
        uVar14 = uVar11;
        if (uVar11 < sVar9) {
          uVar14 = sVar9;
        }
        for (; (local_d0 = uVar14, uVar11 < sVar9 &&
               ((pcVar6[uVar11] == ' ' || (local_d0 = uVar11, pcVar6[uVar11] == '\t'))));
            uVar11 = uVar11 + 1) {
        }
        local_d0 = local_d0 - 1;
        goto switchD_002133d6_caseD_5d;
      }
    }
    local_d0 = local_d0 + 1;
switchD_002133d6_caseD_5d:
    local_d0 = local_d0 + 1;
  } while( true );
}

Assistant:

csubstr Parser::_filter_dquot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfdq(...) _c4dbgpf("filt_dquo_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfdq(...)
    #endif

    _c4dbgfdq(": before=~~~{}~~~", s);

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/double-quoted
    //
    // All leading and trailing white space characters are excluded
    // from the content. Each continuation line must therefore contain
    // at least one non-space character. Empty lines, if any, are
    // consumed as part of the line folding.

    _grow_filter_arena(s.len + 2u * s.count('\\'));
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfdq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/true, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\\')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            _c4dbgfdq("[{}]: backslash, next='{}'", i, _c4prc(next));
            filtered_chars = true;
            if(next == '\r')
            {
                if(i+2 < r.len && r[i+2] == '\n')
                {
                    ++i; // newline escaped with \ -- skip both (add only one as i is loop-incremented)
                    next = '\n';
                    _c4dbgfdq("[{}]: was \\r\\n, now next='\\n'", i);
                }
            }
            // remember the loop will also increment i
            if(next == '\n')
            {
                size_t ii = i + 2;
                for( ; ii < r.len; ++ii)
                {
                    if(r.str[ii] == ' ' || r.str[ii] == '\t')  // skip leading whitespace
                        ;
                    else
                        break;
                }
                i += ii - i - 1;
            }
            else if(next == '"' || next == '/'  || next == ' ' || next == '\t') // escapes for json compatibility
            {
                m_filter_arena.str[pos++] = next;
                ++i;
            }
            else if(next == '\r')
            {
                //++i;
            }
            else if(next == 'n')
            {
                m_filter_arena.str[pos++] = '\n';
                ++i;
            }
            else if(next == 'r')
            {
                m_filter_arena.str[pos++] = '\r';
                ++i; // skip
            }
            else if(next == 't')
            {
                m_filter_arena.str[pos++] = '\t';
                ++i;
            }
            else if(next == '\\')
            {
                m_filter_arena.str[pos++] = '\\';
                ++i;
            }
            else if(next == 'x') // UTF8
            {
                if(i + 1u + 2u >= r.len)
                    _c4err("\\x requires 2 hex digits");
                uint8_t byteval = {};
                if(!read_hex(r.sub(i + 2u, 2u), &byteval))
                    _c4err("failed to read \\x codepoint");
                m_filter_arena.str[pos++] = *(char*)&byteval;
                i += 1u + 2u;
            }
            else if(next == 'u') // UTF16
            {
                if(i + 1u + 4u >= r.len)
                    _c4err("\\u requires 4 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 4u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\u codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 4u;
            }
            else if(next == 'U') // UTF32
            {
                if(i + 1u + 8u >= r.len)
                    _c4err("\\U requires 8 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 8u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\U codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 8u;
            }
            // https://yaml.org/spec/1.2.2/#rule-c-ns-esc-char
            else if(next == '0')
            {
                m_filter_arena.str[pos++] = '\0';
                ++i;
            }
            else if(next == 'b') // backspace
            {
                m_filter_arena.str[pos++] = '\b';
                ++i;
            }
            else if(next == 'f') // form feed
            {
                m_filter_arena.str[pos++] = '\f';
                ++i;
            }
            else if(next == 'a') // bell character
            {
                m_filter_arena.str[pos++] = '\a';
                ++i;
            }
            else if(next == 'v') // vertical tab
            {
                m_filter_arena.str[pos++] = '\v';
                ++i;
            }
            else if(next == 'e') // escape character
            {
                m_filter_arena.str[pos++] = '\x1b';
                ++i;
            }
            else if(next == '_') // unicode non breaking space \u00a0
            {
                // https://www.compart.com/en/unicode/U+00a0
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x60, 0xa0);
                ++i;
            }
            else if(next == 'N') // unicode next line \u0085
            {
                // https://www.compart.com/en/unicode/U+0085
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x7b, 0x85);
                ++i;
            }
            else if(next == 'L') // unicode line separator \u2028
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x58, 0xa8);
                ++i;
            }
            else if(next == 'P') // unicode paragraph separator \u2029
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x57, 0xa9);
                ++i;
            }
            _c4dbgfdq("[{}]: backslash...sofar=[{}]~~~{}~~~", i, pos, m_filter_arena.first(pos));
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfdq

    return r;
}